

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O1

int mbedtls_cipher_cmac_finish(mbedtls_cipher_context_t *ctx,uchar *output)

{
  uchar *buf;
  mbedtls_cmac_context_t *input;
  int iVar1;
  size_t idx;
  ulong uVar2;
  size_t j;
  ulong uVar3;
  ulong ilen;
  uchar M_last [16];
  uchar K2 [16];
  uchar K1 [16];
  size_t olen;
  byte local_68 [16];
  byte local_58 [16];
  byte local_48 [16];
  size_t local_38;
  
  if (ctx == (mbedtls_cipher_context_t *)0x0) {
    return -0x6100;
  }
  if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
    return -0x6100;
  }
  input = ctx->cmac_ctx;
  if (output == (uchar *)0x0 || input == (mbedtls_cmac_context_t *)0x0) {
    return -0x6100;
  }
  ilen = (ulong)ctx->cipher_info->block_size;
  mbedtls_platform_zeroize(local_48,0x10);
  mbedtls_platform_zeroize(local_58,0x10);
  cmac_generate_subkeys(ctx,local_48,local_58);
  buf = input->unprocessed_block;
  uVar2 = input->unprocessed_len;
  if (uVar2 < ilen) {
    uVar3 = 0;
    do {
      if (uVar3 < uVar2) {
        local_68[uVar3] = buf[uVar3];
      }
      else if (uVar3 == uVar2) {
        local_68[uVar3] = 0x80;
      }
      else {
        local_68[uVar3] = 0;
      }
      uVar3 = uVar3 + 1;
    } while (ilen != uVar3);
    uVar2 = 0;
    do {
      local_68[uVar2] = local_68[uVar2] ^ local_58[uVar2];
      uVar2 = uVar2 + 1;
    } while (ilen != uVar2);
  }
  else {
    if (ilen == 0) goto LAB_001250cd;
    uVar2 = 0;
    do {
      local_68[uVar2] = local_48[uVar2] ^ buf[uVar2];
      uVar2 = uVar2 + 1;
    } while (ilen != uVar2);
  }
  if (ilen != 0) {
    uVar2 = 0;
    do {
      input->state[uVar2] = input->state[uVar2] ^ local_68[uVar2];
      uVar2 = uVar2 + 1;
    } while (ilen != uVar2);
  }
LAB_001250cd:
  iVar1 = mbedtls_cipher_update(ctx,input->state,ilen,input->state,&local_38);
  if (iVar1 == 0) {
    memcpy(output,input,ilen);
  }
  mbedtls_platform_zeroize(local_48,0x10);
  mbedtls_platform_zeroize(local_58,0x10);
  input->unprocessed_len = 0;
  mbedtls_platform_zeroize(buf,0x10);
  mbedtls_platform_zeroize(input,0x10);
  return iVar1;
}

Assistant:

int mbedtls_cipher_cmac_finish( mbedtls_cipher_context_t *ctx,
                                unsigned char *output )
{
    mbedtls_cmac_context_t* cmac_ctx;
    unsigned char *state, *last_block;
    unsigned char K1[MBEDTLS_CIPHER_BLKSIZE_MAX];
    unsigned char K2[MBEDTLS_CIPHER_BLKSIZE_MAX];
    unsigned char M_last[MBEDTLS_CIPHER_BLKSIZE_MAX];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen, block_size;

    if( ctx == NULL || ctx->cipher_info == NULL || ctx->cmac_ctx == NULL ||
        output == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    cmac_ctx = ctx->cmac_ctx;
    block_size = ctx->cipher_info->block_size;
    state = cmac_ctx->state;

    mbedtls_platform_zeroize( K1, sizeof( K1 ) );
    mbedtls_platform_zeroize( K2, sizeof( K2 ) );
    cmac_generate_subkeys( ctx, K1, K2 );

    last_block = cmac_ctx->unprocessed_block;

    /* Calculate last block */
    if( cmac_ctx->unprocessed_len < block_size )
    {
        cmac_pad( M_last, block_size, last_block, cmac_ctx->unprocessed_len );
        cmac_xor_block( M_last, M_last, K2, block_size );
    }
    else
    {
        /* Last block is complete block */
        cmac_xor_block( M_last, last_block, K1, block_size );
    }


    cmac_xor_block( state, M_last, state, block_size );
    if( ( ret = mbedtls_cipher_update( ctx, state, block_size, state,
                                       &olen ) ) != 0 )
    {
        goto exit;
    }

    memcpy( output, state, block_size );

exit:
    /* Wipe the generated keys on the stack, and any other transients to avoid
     * side channel leakage */
    mbedtls_platform_zeroize( K1, sizeof( K1 ) );
    mbedtls_platform_zeroize( K2, sizeof( K2 ) );

    cmac_ctx->unprocessed_len = 0;
    mbedtls_platform_zeroize( cmac_ctx->unprocessed_block,
                              sizeof( cmac_ctx->unprocessed_block ) );

    mbedtls_platform_zeroize( state, MBEDTLS_CIPHER_BLKSIZE_MAX );
    return( ret );
}